

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_stream.cpp
# Opt level: O2

void boost::deflate::inflate_stream_test::testFixedHuffmanFlushTrees(IDecompressor *d)

{
  runner *prVar1;
  bool cond;
  int iVar2;
  uint extraout_var;
  uint extraout_var_00;
  undefined4 extraout_var_01;
  string out;
  
  out._M_dataplus._M_p = (pointer)&out.field_2;
  std::__cxx11::string::_M_construct((ulong)&out,'\x05');
  (**d->_vptr_IDecompressor)(d);
  (*d->_vptr_IDecompressor[5])(d);
  (*d->_vptr_IDecompressor[9])(d,out._M_dataplus._M_p);
  (*d->_vptr_IDecompressor[3])(d,0xb);
  (*d->_vptr_IDecompressor[7])(d,out._M_string_length);
  (*d->_vptr_IDecompressor[10])(d,6);
  test_suite::detail::runner::maybe_fail<bool>
            (test_suite::detail::current()::p,(extraout_var & 1) == 0,"!ec",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/inflate_stream.cpp"
             ,0x294,
             "static void boost::deflate::inflate_stream_test::testFixedHuffmanFlushTrees(IDecompressor &)"
             ,(char *)0x0);
  (*d->_vptr_IDecompressor[10])(d,3);
  test_suite::detail::runner::maybe_fail<bool>
            (test_suite::detail::current()::p,(extraout_var_00 & 1) == 0,"!ec",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/inflate_stream.cpp"
             ,0x296,
             "static void boost::deflate::inflate_stream_test::testFixedHuffmanFlushTrees(IDecompressor &)"
             ,(char *)0x0);
  prVar1 = test_suite::detail::current()::p;
  iVar2 = (*d->_vptr_IDecompressor[6])(d);
  test_suite::detail::runner::maybe_fail<bool>
            (prVar1,CONCAT44(extraout_var_01,iVar2) == 0,"d.avail_out() == 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/inflate_stream.cpp"
             ,0x297,
             "static void boost::deflate::inflate_stream_test::testFixedHuffmanFlushTrees(IDecompressor &)"
             ,(char *)0x0);
  prVar1 = test_suite::detail::current()::p;
  cond = std::operator==(&out,"Hello");
  test_suite::detail::runner::maybe_fail<bool>
            (prVar1,cond,"out == \"Hello\"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/inflate_stream.cpp"
             ,0x298,
             "static void boost::deflate::inflate_stream_test::testFixedHuffmanFlushTrees(IDecompressor &)"
             ,(char *)0x0);
  std::__cxx11::string::~string((string *)&out);
  return;
}

Assistant:

static
    void testFixedHuffmanFlushTrees(IDecompressor& d)
    {
        std::string out(5, 0);
        d.init();
        error_code ec;
        std::initializer_list<std::uint8_t> in = {
            0xf2, 0x48, 0xcd, 0xc9, 0xc9, 0x07, 0x00, 0x00,
            0x00, 0xff, 0xff};
        d.next_in(&*in.begin());
        d.next_out(&out[0]);
        d.avail_in(in.size());
        d.avail_out(out.size());
        ec = d.write(Flush::trees);
        BOOST_TEST(!ec);
        ec = d.write(Flush::sync);
        BOOST_TEST(!ec);
        BOOST_TEST(d.avail_out() == 0);
        BOOST_TEST(out == "Hello");
    }